

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O2

IOTHUB_SECURITY_HANDLE iothub_device_auth_create(void)

{
  HSM_CLIENT_SIGN_WITH_IDENTITY p_Var1;
  HSM_CLIENT_GET_CERTIFICATE p_Var2;
  HSM_CLIENT_GET_ALIAS_KEY p_Var3;
  HSM_CLIENT_GET_SYMMETRICAL_KEY p_Var4;
  bool bVar5;
  IOTHUB_SECURITY_TYPE IVar6;
  int iVar7;
  IOTHUB_SECURITY_HANDLE __ptr;
  HSM_CLIENT_TPM_INTERFACE *pHVar8;
  LOGGER_LOG p_Var9;
  HSM_CLIENT_X509_INTERFACE *pHVar10;
  HSM_CLIENT_KEY_INTERFACE *pHVar11;
  HSM_CLIENT_HANDLE pvVar12;
  char *pcVar13;
  HSM_CLIENT_CREATE p_Var14;
  char *pcVar15;
  HSM_CLIENT_DESTROY p_Var16;
  HSM_CLIENT_SET_SYMMETRICAL_KEY_INFO p_Var17;
  
  IVar6 = iothub_security_type();
  __ptr = (IOTHUB_SECURITY_HANDLE)calloc(1,0x70);
  if (__ptr == (IOTHUB_SECURITY_HANDLE)0x0) {
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 == (LOGGER_LOG)0x0) {
      return (IOTHUB_SECURITY_HANDLE)0x0;
    }
    pcVar15 = "Failed allocating IOTHUB_SECURITY_INFO.";
    iVar7 = 0x82;
    goto LAB_00143183;
  }
  if (IVar6 == IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY) {
    __ptr->cred_type = AUTH_TYPE_SYMM_KEY;
    __ptr->base64_encode_signature = true;
    __ptr->urlencode_token_scope = false;
    pHVar11 = hsm_client_key_interface();
    if (pHVar11 != (HSM_CLIENT_KEY_INTERFACE *)0x0) {
      p_Var14 = pHVar11->hsm_client_key_create;
      __ptr->hsm_client_create = p_Var14;
      if (p_Var14 != (HSM_CLIENT_CREATE)0x0) {
        p_Var16 = pHVar11->hsm_client_key_destroy;
        __ptr->hsm_client_destroy = p_Var16;
        if ((p_Var16 != (HSM_CLIENT_DESTROY)0x0) &&
           (p_Var4 = pHVar11->hsm_client_get_symm_key, __ptr->hsm_client_get_symm_key = p_Var4,
           p_Var4 != (HSM_CLIENT_GET_SYMMETRICAL_KEY)0x0)) {
          p_Var17 = pHVar11->hsm_client_set_symm_key_info;
          __ptr->hsm_client_set_symm_key_info = p_Var17;
          bVar5 = true;
          if (p_Var17 != (HSM_CLIENT_SET_SYMMETRICAL_KEY_INFO)0x0) goto LAB_00143033;
        }
      }
    }
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      pcVar15 = "Invalid x509 secure device interface was specified";
      iVar7 = 0xbc;
LAB_00143144:
      (*p_Var9)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                ,"iothub_device_auth_create",iVar7,1,pcVar15);
    }
  }
  else if (IVar6 == IOTHUB_SECURITY_TYPE_X509) {
    __ptr->cred_type = AUTH_TYPE_X509;
    __ptr->base64_encode_signature = true;
    __ptr->urlencode_token_scope = false;
    pHVar10 = hsm_client_x509_interface();
    if (pHVar10 != (HSM_CLIENT_X509_INTERFACE *)0x0) {
      p_Var14 = pHVar10->hsm_client_x509_create;
      __ptr->hsm_client_create = p_Var14;
      if (p_Var14 != (HSM_CLIENT_CREATE)0x0) {
        p_Var16 = pHVar10->hsm_client_x509_destroy;
        __ptr->hsm_client_destroy = p_Var16;
        if (((p_Var16 != (HSM_CLIENT_DESTROY)0x0) &&
            (p_Var2 = pHVar10->hsm_client_get_cert, __ptr->hsm_client_get_cert = p_Var2,
            p_Var2 != (HSM_CLIENT_GET_CERTIFICATE)0x0)) &&
           (p_Var3 = pHVar10->hsm_client_get_key, __ptr->hsm_client_get_alias_key = p_Var3,
           p_Var3 != (HSM_CLIENT_GET_ALIAS_KEY)0x0)) {
LAB_00142fcb:
          p_Var17 = (HSM_CLIENT_SET_SYMMETRICAL_KEY_INFO)0x0;
          bVar5 = false;
LAB_00143033:
          pvVar12 = (*p_Var14)();
          __ptr->hsm_client_handle = pvVar12;
          if (pvVar12 != (HSM_CLIENT_HANDLE)0x0) {
            if (!bVar5) {
              return __ptr;
            }
            pcVar15 = iothub_security_get_symm_registration_name();
            pcVar13 = iothub_security_get_symmetric_key();
            iVar7 = (*p_Var17)(pvVar12,pcVar15,pcVar13);
            if (iVar7 == 0) {
              return __ptr;
            }
            p_Var9 = xlogging_get_log_function();
            if (p_Var9 != (LOGGER_LOG)0x0) {
              (*p_Var9)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                        ,"iothub_device_auth_create",0xea,1,
                        "Invalid x509 secure device interface was specified");
            }
            (*p_Var16)(pvVar12);
            goto LAB_001430db;
          }
          p_Var9 = xlogging_get_log_function();
          if (p_Var9 == (LOGGER_LOG)0x0) goto LAB_001430db;
          pcVar15 = "failed create device auth module.";
          iVar7 = 0xe4;
          goto LAB_001430d6;
        }
      }
    }
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      pcVar15 = "Invalid handle parameter: DEVICE_AUTH_CREATION_INFO is NULL";
      iVar7 = 0xa8;
      goto LAB_00143144;
    }
  }
  else {
    if (IVar6 != IOTHUB_SECURITY_TYPE_SAS) {
      p_Var9 = xlogging_get_log_function();
      if (p_Var9 == (LOGGER_LOG)0x0) goto LAB_001430db;
      pcVar15 = "hsm_client_create is not a valid address";
      iVar7 = 0xdc;
LAB_001430d6:
      (*p_Var9)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                ,"iothub_device_auth_create",iVar7,1,pcVar15);
LAB_001430db:
      free(__ptr);
      return (IOTHUB_SECURITY_HANDLE)0x0;
    }
    __ptr->cred_type = AUTH_TYPE_SAS;
    __ptr->base64_encode_signature = true;
    __ptr->urlencode_token_scope = false;
    pHVar8 = hsm_client_tpm_interface();
    if (pHVar8 != (HSM_CLIENT_TPM_INTERFACE *)0x0) {
      p_Var14 = pHVar8->hsm_client_tpm_create;
      __ptr->hsm_client_create = p_Var14;
      if (p_Var14 != (HSM_CLIENT_CREATE)0x0) {
        p_Var16 = pHVar8->hsm_client_tpm_destroy;
        __ptr->hsm_client_destroy = p_Var16;
        if ((p_Var16 != (HSM_CLIENT_DESTROY)0x0) &&
           (p_Var1 = pHVar8->hsm_client_sign_with_identity, __ptr->hsm_client_sign_data = p_Var1,
           p_Var1 != (HSM_CLIENT_SIGN_WITH_IDENTITY)0x0)) goto LAB_00142fcb;
      }
    }
    p_Var9 = xlogging_get_log_function();
    if (p_Var9 != (LOGGER_LOG)0x0) {
      pcVar15 = "Invalid secure device interface";
      iVar7 = 0x94;
      goto LAB_00143144;
    }
  }
  free(__ptr);
  p_Var9 = xlogging_get_log_function();
  if (p_Var9 == (LOGGER_LOG)0x0) {
    return (IOTHUB_SECURITY_HANDLE)0x0;
  }
  pcVar15 = "Error allocating result or else unsupported security type %d";
  iVar7 = 0xd8;
LAB_00143183:
  (*p_Var9)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
            ,"iothub_device_auth_create",iVar7,1,pcVar15);
  return (IOTHUB_SECURITY_HANDLE)0x0;
}

Assistant:

IOTHUB_SECURITY_HANDLE iothub_device_auth_create()
{
    IOTHUB_SECURITY_INFO* result;

    IOTHUB_SECURITY_TYPE iothub_security_t = iothub_security_type();

    if ((result = (IOTHUB_SECURITY_INFO*)malloc(sizeof(IOTHUB_SECURITY_INFO))) == NULL)
    {
        LogError("Failed allocating IOTHUB_SECURITY_INFO.");
    }
    else
    {
        memset(result, 0, sizeof(IOTHUB_SECURITY_INFO) );
#if defined(HSM_TYPE_SAS_TOKEN)  || defined(HSM_AUTH_TYPE_CUSTOM)
        if (iothub_security_t == IOTHUB_SECURITY_TYPE_SAS)
        {
            result->cred_type = AUTH_TYPE_SAS;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_TPM_INTERFACE* tpm_interface = hsm_client_tpm_interface();
            if ((tpm_interface == NULL) ||
                ((result->hsm_client_create = tpm_interface->hsm_client_tpm_create) == NULL) ||
                ((result->hsm_client_destroy = tpm_interface->hsm_client_tpm_destroy) == NULL) ||
                ((result->hsm_client_sign_data = tpm_interface->hsm_client_sign_with_identity) == NULL)
                )
            {
                LogError("Invalid secure device interface");
                free(result);
                result = NULL;
            }
        }
#endif
#if defined(HSM_TYPE_X509) || defined(HSM_TYPE_RIOT) || defined(HSM_AUTH_TYPE_CUSTOM)
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_X509)
        {
            result->cred_type = AUTH_TYPE_X509;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_X509_INTERFACE* x509_interface = hsm_client_x509_interface();
            if ((x509_interface == NULL) ||
                ((result->hsm_client_create = x509_interface->hsm_client_x509_create) == NULL) ||
                ((result->hsm_client_destroy = x509_interface->hsm_client_x509_destroy) == NULL) ||
                ((result->hsm_client_get_cert = x509_interface->hsm_client_get_cert) == NULL) ||
                ((result->hsm_client_get_alias_key = x509_interface->hsm_client_get_key) == NULL)
                )
            {
                LogError("Invalid handle parameter: DEVICE_AUTH_CREATION_INFO is NULL");
                free(result);
                result = NULL;
            }
        }
#endif
#if defined(HSM_TYPE_SYMM_KEY) || defined(HSM_AUTH_TYPE_CUSTOM)
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_SYMMETRIC_KEY)
        {
            result->cred_type = AUTH_TYPE_SYMM_KEY;
            result->base64_encode_signature = true;
            result->urlencode_token_scope = false;
            const HSM_CLIENT_KEY_INTERFACE* key_interface = hsm_client_key_interface();
            if ((key_interface == NULL) ||
                ((result->hsm_client_create = key_interface->hsm_client_key_create) == NULL) ||
                ((result->hsm_client_destroy = key_interface->hsm_client_key_destroy) == NULL) ||
                ((result->hsm_client_get_symm_key = key_interface->hsm_client_get_symm_key) == NULL) ||
                ((result->hsm_client_set_symm_key_info = key_interface->hsm_client_set_symm_key_info) == NULL)
                )
            {
                LogError("Invalid x509 secure device interface was specified");
                free(result);
                result = NULL;
            }
        }
#endif
#ifdef HSM_TYPE_HTTP_EDGE
        if (result != NULL && iothub_security_t == IOTHUB_SECURITY_TYPE_HTTP_EDGE)
        {
            result->cred_type = AUTH_TYPE_SAS;
            // Because HTTP_edge operates over HTTP, the server has already base64 encoded signature its returning to us.
            result->base64_encode_signature = false;
            result->urlencode_token_scope = true;
            const HSM_CLIENT_HTTP_EDGE_INTERFACE* http_edge_interface = hsm_client_http_edge_interface();
            if ((http_edge_interface == NULL) ||
                ((result->hsm_client_create = http_edge_interface->hsm_client_http_edge_create) == NULL) ||
                ((result->hsm_client_destroy = http_edge_interface->hsm_client_http_edge_destroy) == NULL) ||
                ((result->hsm_client_sign_data = http_edge_interface->hsm_client_sign_with_identity) == NULL) ||
                ((result->hsm_client_get_trust_bundle = http_edge_interface->hsm_client_get_trust_bundle) == NULL))
            {
                LogError("Invalid secure device interface");
                free(result);
                result = NULL;
            }
        }
#endif
        if (result == NULL)
        {
            LogError("Error allocating result or else unsupported security type %d", iothub_security_t);
        }
        else if (result->hsm_client_create == NULL)
        {
            LogError("hsm_client_create is not a valid address");
            free(result);
            result = NULL;
        }
        else
        {
            if ((result->hsm_client_handle = result->hsm_client_create()) == NULL)
            {
                LogError("failed create device auth module.");
                free(result);
                result = NULL;
            }
            else if (result->cred_type == AUTH_TYPE_SYMM_KEY && result->hsm_client_set_symm_key_info(result->hsm_client_handle, iothub_security_get_symm_registration_name(), iothub_security_get_symmetric_key()) != 0)
            {
                LogError("Invalid x509 secure device interface was specified");
                result->hsm_client_destroy(result->hsm_client_handle);
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}